

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.hpp
# Opt level: O2

void __thiscall tcu::Sampler::Sampler(Sampler *this)

{
  this->wrapS = WRAPMODE_LAST;
  this->wrapT = WRAPMODE_LAST;
  this->wrapR = WRAPMODE_LAST;
  this->minFilter = FILTERMODE_LAST;
  this->magFilter = FILTERMODE_LAST;
  this->lodThreshold = 0.0;
  this->normalizedCoords = true;
  this->depthStencilMode = MODE_DEPTH;
  this->compare = COMPAREMODE_NONE;
  this->compareChannel = 0;
  *(undefined8 *)&(this->borderColor).v = 0;
  *(undefined8 *)((long)&(this->borderColor).v + 1) = 0;
  *(undefined8 *)((long)&(this->borderColor).v + 9) = 0;
  return;
}

Assistant:

Sampler (void)
		: wrapS				(WRAPMODE_LAST)
		, wrapT				(WRAPMODE_LAST)
		, wrapR				(WRAPMODE_LAST)
		, minFilter			(FILTERMODE_LAST)
		, magFilter			(FILTERMODE_LAST)
		, lodThreshold		(0.0f)
		, normalizedCoords	(true)
		, compare			(COMPAREMODE_NONE)
		, compareChannel	(0)
		, borderColor		(Vec4(0.0f, 0.0f, 0.0f, 0.0f))
		, seamlessCubeMap	(false)
		, depthStencilMode	(MODE_DEPTH)
	{
	}